

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

int vorbis_commentheader_out(vorbis_comment *vc,ogg_packet *op)

{
  size_t sVar1;
  uchar *__dest;
  long lVar2;
  oggpack_buffer opb;
  oggpack_buffer oStack_48;
  
  oggpack_writeinit(&oStack_48);
  _vorbis_pack_comment(&oStack_48,vc);
  sVar1 = oggpack_bytes(&oStack_48);
  __dest = (uchar *)malloc(sVar1);
  op->packet = __dest;
  sVar1 = oggpack_bytes(&oStack_48);
  memcpy(__dest,oStack_48.buffer,sVar1);
  lVar2 = oggpack_bytes(&oStack_48);
  op->bytes = lVar2;
  op->b_o_s = 0;
  op->e_o_s = 0;
  op->granulepos = 0;
  op->packetno = 1;
  oggpack_writeclear(&oStack_48);
  return 0;
}

Assistant:

int vorbis_commentheader_out(vorbis_comment *vc,
                                          ogg_packet *op){

  oggpack_buffer opb;

  oggpack_writeinit(&opb);
  if(_vorbis_pack_comment(&opb,vc)){
    oggpack_writeclear(&opb);
    return OV_EIMPL;
  }

  op->packet = _ogg_malloc(oggpack_bytes(&opb));
  memcpy(op->packet, opb.buffer, oggpack_bytes(&opb));

  op->bytes=oggpack_bytes(&opb);
  op->b_o_s=0;
  op->e_o_s=0;
  op->granulepos=0;
  op->packetno=1;

  oggpack_writeclear(&opb);
  return 0;
}